

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMarkers::ChLinkMarkers(ChLinkMarkers *this)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [32];
  
  ChLink::ChLink(&this->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChPhysicsItem_01161f60;
  this->markID1 = 0;
  this->markID2 = 0;
  this->marker1 = (ChMarker *)0x0;
  this->marker2 = (ChMarker *)0x0;
  ChCoordsys<double>::ChCoordsys(&this->relM,(ChCoordsys<double> *)CSYSNORM);
  ChCoordsys<double>::ChCoordsys(&this->relM_dt,(ChCoordsys<double> *)CSYSNULL);
  ChCoordsys<double>::ChCoordsys(&this->relM_dtdt,(ChCoordsys<double> *)CSYSNULL);
  auVar4 = _DAT_00e79d40;
  this->relAngle = 0.0;
  (this->relAxis).m_data[0] = 0.0;
  (this->relAxis).m_data[1] = 0.0;
  (this->relAxis).m_data[2] = 0.0;
  dVar3 = DAT_011dd3e8;
  auVar5._8_8_ = VNULL;
  auVar5._0_8_ = VNULL;
  auVar5._16_8_ = VNULL;
  auVar5._24_8_ = VNULL;
  auVar2._8_8_ = DAT_011dd3e8;
  auVar2._0_8_ = DAT_011dd3e0;
  auVar4 = vpermi2pd_avx512f(auVar4,ZEXT1664(auVar2),ZEXT3264(auVar5));
  this->relRotaxis = (ChVector<double>)auVar4._0_24_;
  this->relWvel = (ChVector<double>)auVar4._24_24_;
  (this->relWacc).m_data[0] = (double)auVar4._48_8_;
  (this->relWacc).m_data[1] = (double)auVar4._56_8_;
  auVar1 = vpermpd_avx2(ZEXT1632(auVar2),0xd0);
  (this->relWacc).m_data[2] = dVar3;
  auVar1 = vblendpd_avx(auVar5,auVar1,6);
  this->C_force = (ChVector<double>)auVar1._0_24_;
  (this->C_torque).m_data[0] = (double)auVar1._24_8_;
  *(undefined1 (*) [16])((this->C_torque).m_data + 1) = auVar2;
  (this->PQw_dtdt).m_data[2] = 0.0;
  (this->q_AD).m_data[0] = 0.0;
  (this->q_AD).m_data[1] = 0.0;
  (this->q_AD).m_data[2] = 0.0;
  (this->q_AD).m_data[3] = 0.0;
  (this->q_BC).m_data[0] = 0.0;
  (this->q_BC).m_data[1] = 0.0;
  (this->q_BC).m_data[2] = 0.0;
  (this->q_BC).m_data[3] = 0.0;
  (this->q_8).m_data[0] = 0.0;
  (this->q_8).m_data[1] = 0.0;
  (this->q_8).m_data[2] = 0.0;
  (this->q_8).m_data[3] = 0.0;
  (this->q_4).m_data[0] = 0.0;
  (this->q_4).m_data[1] = 0.0;
  (this->q_4).m_data[2] = 0.0;
  (this->PQw).m_data[0] = 0.0;
  (this->PQw).m_data[1] = 0.0;
  (this->PQw).m_data[2] = 0.0;
  (this->PQw_dt).m_data[0] = 0.0;
  (this->PQw_dt).m_data[1] = 0.0;
  (this->PQw_dt).m_data[2] = 0.0;
  (this->PQw_dtdt).m_data[0] = 0.0;
  (this->PQw_dtdt).m_data[1] = 0.0;
  return;
}

Assistant:

ChLinkMarkers::ChLinkMarkers()
    : marker1(NULL),
      marker2(NULL),
      markID1(0),
      markID2(0),
      relM(CSYSNORM),
      relM_dt(CSYSNULL),
      relM_dtdt(CSYSNULL),
      relAngle(0),
      relRotaxis(VNULL),
      relWvel(VNULL),
      relWacc(VNULL),
      C_force(VNULL),
      C_torque(VNULL) {}